

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraCodeLiteGenerator::GetConfigurationName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  pointer pcVar1;
  string *psVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_BUILD_TYPE","");
  psVar2 = cmMakefile::GetSafeDefinition(mf,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find_first_not_of((char *)__return_storage_ptr__,0x53b874,0);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar3 = std::__cxx11::string::find_last_not_of
                    ((char *)__return_storage_ptr__,0x53b874,0xffffffffffffffff);
  uVar4 = lVar3 + 1;
  if (uVar4 <= __return_storage_ptr__->_M_string_length) {
    __return_storage_ptr__->_M_string_length = uVar4;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar4] = '\0';
    if (__return_storage_ptr__->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x53b4d0);
    }
    return __return_storage_ptr__;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar4);
  _Unwind_Resume(uVar5);
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetConfigurationName(
  const cmMakefile* mf) const
{
  std::string confName = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Trim the configuration name from whitespaces (left and right)
  confName.erase(0, confName.find_first_not_of(" \t\r\v\n"));
  confName.erase(confName.find_last_not_of(" \t\r\v\n") + 1);
  if (confName.empty()) {
    confName = "NoConfig";
  }
  return confName;
}